

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::UniformLocNonDec::Run(UniformLocNonDec *this)

{
  long lVar1;
  DefOccurence local_560;
  DefOccurence local_55c;
  LayoutSpecifierBase local_558;
  LayoutSpecifierBase local_548;
  UniformType local_538;
  Uniform local_4a8;
  LayoutSpecifierBase local_2d0;
  DefOccurence local_2c0;
  DefOccurence local_2bc;
  LayoutSpecifierBase local_2b8;
  LayoutSpecifierBase local_2a8;
  UniformType local_290;
  Uniform local_200;
  undefined1 local_28 [8];
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  UniformLocNonDec *this_local;
  
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
            *)local_28);
  UniformType::UniformType(&local_290,0x8b52,0);
  local_2b8 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(10,Hex);
  local_2a8 = local_2b8;
  DefOccurence::DefOccurence(&local_2bc,FSH_OR_CSH);
  DefOccurence::DefOccurence(&local_2c0,ALL_SH);
  local_2d0 = local_2a8;
  anon_unknown_0::Uniform::Uniform
            (&local_200,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_290,(Loc)local_2a8,local_2bc,local_2c0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_200);
  anon_unknown_0::Uniform::~Uniform(&local_200);
  UniformType::~UniformType(&local_290);
  UniformType::UniformType(&local_538,0x8b52,0);
  local_558 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(8,Oct);
  local_548 = local_558;
  DefOccurence::DefOccurence(&local_55c,FSH_OR_CSH);
  DefOccurence::DefOccurence(&local_560,ALL_SH);
  anon_unknown_0::Uniform::Uniform
            (&local_4a8,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_538,(Loc)local_548,local_55c,local_560);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_4a8);
  anon_unknown_0::Uniform::~Uniform(&local_4a8);
  UniformType::~UniformType(&local_538);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)local_28);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
             *)local_28);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//layout (location = 0x0a) uniform vec4 u0;
		//layout (location = 010) uniform vec4  u1;
		std::vector<Uniform> uniforms;
		uniforms.push_back(
			Uniform(uniformValueGenerator, GL_FLOAT_VEC4, Loc::C(0x0a, Loc::Hex), DefOccurence::FSH_OR_CSH));
		uniforms.push_back(
			Uniform(uniformValueGenerator, GL_FLOAT_VEC4, Loc::C(010, Loc::Oct), DefOccurence::FSH_OR_CSH));
		return doRun(uniforms);
	}